

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O2

Am_Object am_invoke_window_Initialize(void)

{
  Am_Slot_Key AVar1;
  Am_Object *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Constraint *pAVar4;
  Am_Object *pAVar5;
  Am_Value_List *pAVar6;
  Am_Slot_Key sibling;
  Am_Object_Data *in_RDI;
  Am_Object accel_input_widget;
  Am_Formula local_128;
  Am_Formula local_118;
  Am_Object sg;
  Am_Value local_100;
  Am_Object local_f0;
  Am_Value local_e8;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  
  Am_Object::Create(&accel_input_widget,(char *)&Am_Command);
  pAVar2 = Am_Object::Set(&accel_input_widget,0x150,"Before_After_Match",0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SHOW_SCRIPT_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_COMMANDS_IN_SCRIPT,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_COMMANDS_PROTOTYPES,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0xc5,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_ORIGINAL_COMMAND_LIST,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_PLACEHOLDER_LIST,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_PLACEHOLDER_COUNT,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_BEFORE_OR_AFTER,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_BEFORE_OR_AFTER_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_ORIG_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_INSTALLED_ON_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_WIDGET_FOR_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SCRIPT_EXECUTE_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,0xb8,0,0);
  Am_Object::operator=(&Am_Before_After_Match_Command,pAVar2);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Object::Create(&accel_input_widget,(char *)&Am_Window);
  pAVar2 = Am_Object::Set(&accel_input_widget,0x89,
                          Am_Default_Pop_Up_Window_Destroy_Method.from_wrapper,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x6c,"How To Invoke Script",0);
  pAVar2 = Am_Object::Set(pAVar2,0x66,0x1d6,0);
  pAVar2 = Am_Object::Set(pAVar2,0x67,0x15e,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_INVOKE_MATCH_COMMAND,0,0);
  pAVar2 = Am_Object::Add(pAVar2,Am_SCRIPT_WINDOW,0,0);
  Am_Object::operator=(&am_invoke_window,pAVar2);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Object::Create(&accel_input_widget,(char *)&Am_Text);
  pAVar2 = Am_Object::Set(&accel_input_widget,100,6,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xb,0);
  pAVar2 = Am_Object::Set(pAVar2,0xab,"Specify how to invoke the script:",0);
  Am_Font::Am_Font((Am_Font *)&local_128,Am_FONT_FIXED,true,false,false,Am_FONT_LARGE);
  pAVar3 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_128);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar3,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar2 = Am_Object::Set(pAVar2,0x6b,pAVar3,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  Am_Object::Am_Object(&local_38,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_38,true,0);
  Am_Object::~Am_Object(&local_38);
  Am_Font::~Am_Font((Am_Font *)&local_128);
  Am_Object::~Am_Object(&accel_input_widget);
  AVar1 = Am_DO_ACCELERATOR;
  Am_Object::Create((Am_Object *)&local_118,(char *)&Am_Checkbox);
  pAVar2 = Am_Object::Set((Am_Object *)&local_118,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x2a,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  Am_Font::Am_Font((Am_Font *)&local_100,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar3 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_100);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar3,0);
  Am_Object::Get_Object((Am_Object *)&local_128,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,0x150,"Accelerator Key:",0);
  pAVar2 = Am_Object::Set(pAVar2,0x153,true,0);
  Am_Object::Get_Owner(&local_40,(Am_Slot_Flags)pAVar2);
  pAVar2 = Am_Object::Add_Part(&am_invoke_window,AVar1,&local_40,0);
  Am_Object::Create(&local_f0,(char *)&Am_Text_Input_Widget);
  sibling = (Am_Slot_Key)&accel_input_widget;
  Am_Right_Of_Sibling(sibling,(uint)Am_DO_ACCELERATOR,1.0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&accel_input_widget);
  pAVar5 = Am_Object::Set(&local_f0,100,pAVar4,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,0x28,0);
  pAVar5 = Am_Object::Set(pAVar5,0x66,100,0);
  pAVar5 = Am_Object::Set(pAVar5,0x67,0x19,0);
  Am_Object::Get_Object(&sg,(Am_Slot_Key)pAVar5,0xc5);
  pAVar5 = Am_Object::Set(&sg,0x150,"",0);
  Am_Object::Get_Owner((Am_Object *)&local_e8,(Am_Slot_Flags)pAVar5);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar5 = Am_Object::Set((Am_Object *)&local_e8,0x6a,pAVar3,0);
  Am_Object::Am_Object(&local_48,pAVar5);
  Am_Object::Add_Part(pAVar2,0x152,&local_48,0);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object((Am_Object *)&local_e8);
  Am_Object::~Am_Object(&sg);
  Am_Formula::~Am_Formula((Am_Formula *)&accel_input_widget);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  Am_Font::~Am_Font((Am_Font *)&local_100);
  Am_Object::~Am_Object((Am_Object *)&local_118);
  Am_Object::Create((Am_Object *)&local_100,(char *)&Am_Button);
  Am_Right_Of_Sibling(sibling,0x152,1.0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&accel_input_widget);
  pAVar2 = Am_Object::Set((Am_Object *)&local_100,100,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x28,0);
  pAVar2 = Am_Object::Set(pAVar2,0x1c7,false,0);
  Am_Object::Get_Object((Am_Object *)&local_118,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set((Am_Object *)&local_118,0x150,"None",0);
  pAVar2 = Am_Object::Set(pAVar2,0xca,clear_accel.from_wrapper,0);
  Am_Object::Get_Owner((Am_Object *)&local_128,(Am_Slot_Flags)pAVar2);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,0x6a,pAVar3,0);
  Am_Object::Am_Object(&local_50,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_50,true,0);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  Am_Object::~Am_Object((Am_Object *)&local_118);
  Am_Formula::~Am_Formula((Am_Formula *)&accel_input_widget);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  AVar1 = Am_DO_MENU;
  Am_Object::Create((Am_Object *)&local_128,(char *)&Am_Checkbox);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x50,0);
  Am_Font::Am_Font((Am_Font *)&local_118,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar3 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_118);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar3,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Object::Get_Object(&accel_input_widget,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&accel_input_widget,0x150,"In Application Menu:",0);
  pAVar2 = Am_Object::Set(pAVar2,0x153,true,0);
  Am_Object::Get_Owner(&local_58,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_58,0);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Font::~Am_Font((Am_Font *)&local_118);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  AVar1 = Am_WHICH_APPL_MENU;
  Am_Object::Create((Am_Object *)&local_100,(char *)&Am_Option_Button);
  pAVar2 = Am_Object::Set((Am_Object *)&local_100,100,0xb4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x4b,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&accel_input_widget);
  pAVar6 = Am_Value_List::Add((Am_Value_List *)&accel_input_widget,"File",Am_TAIL,true);
  pAVar6 = Am_Value_List::Add(pAVar6,"Edit",Am_TAIL,true);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar3,0);
  Am_Object::Get_Object((Am_Object *)&local_118,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set((Am_Object *)&local_118,0xca,do_top_menu_selected.from_wrapper,0);
  Am_Object::Get_Owner((Am_Object *)&local_128,(Am_Slot_Flags)pAVar2);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,0x6a,pAVar3,0);
  Am_Object::Am_Object(&local_60,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_60,0);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  Am_Object::~Am_Object((Am_Object *)&local_118);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&accel_input_widget);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  Am_Object::Create(&accel_input_widget,(char *)&Am_Text);
  pAVar2 = Am_Object::Set(&accel_input_widget,100,0x2d,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x73,0);
  Am_Font::Am_Font((Am_Font *)&local_128,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar3 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_128);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0xab,"Before Sub-Menu Item:",0);
  Am_Object::Am_Object(&local_68,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_68,true,0);
  Am_Object::~Am_Object(&local_68);
  Am_Font::~Am_Font((Am_Font *)&local_128);
  Am_Object::~Am_Object(&accel_input_widget);
  AVar1 = Am_WHICH_APPL_SUB_MENU;
  Am_Object::Create((Am_Object *)&local_100,(char *)&Am_Option_Button);
  pAVar2 = Am_Object::Set((Am_Object *)&local_100,100,0xc3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x6e,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&accel_input_widget);
  pAVar6 = Am_Value_List::Add((Am_Value_List *)&accel_input_widget,"<At end>",Am_TAIL,true);
  pAVar6 = Am_Value_List::Add(pAVar6,"<At top>",Am_TAIL,true);
  pAVar6 = Am_Value_List::Add(pAVar6,"Open",Am_TAIL,true);
  pAVar6 = Am_Value_List::Add(pAVar6,"Close",Am_TAIL,true);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar3,0);
  Am_Object::Get_Object((Am_Object *)&local_118,(Am_Slot_Key)pAVar2,0xc5);
  Am_Object::Get_Owner((Am_Object *)&local_128,(Am_Slot_Flags)&local_118);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,0x6a,pAVar3,0);
  Am_Object::Am_Object(&local_70,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_70,0);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  Am_Object::~Am_Object((Am_Object *)&local_118);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&accel_input_widget);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  Am_Object::Create((Am_Object *)&local_128,(char *)&Am_Checkbox);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0x8c,0);
  Am_Font::Am_Font((Am_Font *)&local_118,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar3 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_118);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar3,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0xcc,false,0);
  Am_Object::Get_Object(&accel_input_widget,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&accel_input_widget,0x150,"At time...",0);
  pAVar2 = Am_Object::Set(pAVar2,0x153,true,0);
  Am_Object::Get_Owner(&local_78,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,&local_78,true,0);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Font::~Am_Font((Am_Font *)&local_118);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  AVar1 = Am_BEFORE_OR_AFTER;
  Am_Object::Create((Am_Object *)&local_118,(char *)&Am_Checkbox_Panel);
  pAVar2 = Am_Object::Set((Am_Object *)&local_118,100,0xf,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xaa,0);
  Am_Font::Am_Font((Am_Font *)&local_100,Am_FONT_FIXED,true,false,false,Am_FONT_MEDIUM);
  pAVar3 = Am_Font::operator_cast_to_Am_Wrapper_((Am_Font *)&local_100);
  pAVar2 = Am_Object::Set(pAVar2,0xac,pAVar3,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&accel_input_widget);
  Am_Object::Create((Am_Object *)&local_e8,(char *)&Am_Command);
  pAVar5 = Am_Object::Set((Am_Object *)&local_e8,0x150,"After Command",0);
  pAVar5 = Am_Object::Set(pAVar5,0x153,0x34,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add((Am_Value_List *)&accel_input_widget,pAVar3,Am_TAIL,true);
  Am_Object::Create(&sg,(char *)&Am_Command);
  pAVar5 = Am_Object::Set(&sg,0x150,"Before Command",0);
  pAVar5 = Am_Object::Set(pAVar5,0x153,0x33,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar3,Am_TAIL,true);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar3,0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Vertical_Layout);
  pAVar2 = Am_Object::Set(pAVar2,0x94,pAVar4,0);
  local_128.super_Am_Registered_Type._vptr_Am_Registered_Type._0_2_ =
       Am_Choice_How_Set::Am_Choice_How_Set_ID;
  local_128.data = (Am_Formula_Data *)Am_CHOICE_TOGGLE.value;
  pAVar2 = Am_Object::Set(pAVar2,0xd4,(Am_Value *)&local_128,0);
  pAVar2 = Am_Object::Set(pAVar2,0x95,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x96,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x9c,0,0);
  Am_Object::Am_Object(&local_80,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_80,0);
  Am_Object::~Am_Object(&local_80);
  Am_Value::~Am_Value((Am_Value *)&local_128);
  Am_Object::~Am_Object(&sg);
  Am_Object::~Am_Object((Am_Object *)&local_e8);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&accel_input_widget);
  Am_Font::~Am_Font((Am_Font *)&local_100);
  Am_Object::~Am_Object((Am_Object *)&local_118);
  AVar1 = Am_COMMAND_LOAD_BUTTON;
  Am_Object::Create((Am_Object *)&local_128,(char *)&Am_Button);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,100,0x91,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xb9,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x1c7,false,0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&am_before_or_after_picked);
  pAVar2 = Am_Object::Set(pAVar2,0xcc,pAVar4,0);
  Am_Object::Get_Object(&accel_input_widget,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&accel_input_widget,0x150,"Load",0);
  pAVar2 = Am_Object::Set(pAVar2,0xca,am_load_current_command_from_main.from_wrapper,0);
  Am_Object::Get_Owner(&local_88,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_88,0);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  AVar1 = Am_COMMAND_GENERALIZE_BUTTON;
  Am_Object::Create((Am_Object *)&local_128,(char *)&Am_Button);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,100,0x122,0);
  pAVar2 = Am_Object::Set(pAVar2,0x65,0xbe,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x1c7,false,0);
  Am_Object::Get_Object(&accel_input_widget,(Am_Slot_Key)pAVar2,0xc5);
  pAVar2 = Am_Object::Set(&accel_input_widget,0x150,"Generalize",0);
  pAVar2 = Am_Object::Set(pAVar2,0xca,am_pop_up_generalize_from_button.from_wrapper,0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&am_generalize_script_active);
  pAVar2 = Am_Object::Set(pAVar2,0xcc,pAVar4,0);
  Am_Object::Get_Owner(&local_90,(Am_Slot_Flags)pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_90,0);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  AVar1 = Am_UNDO_SCROLL_GROUP;
  sg.data = (Am_Object_Data *)0x0;
  Am_Object::Create(&local_f0,(char *)&Am_Scrolling_Menu);
  pAVar2 = Am_Object::Set(&local_f0,100,0xf,0);
  Am_Bottom_Of_Sibling(sibling,(uint)Am_BEFORE_OR_AFTER,1.0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&accel_input_widget);
  pAVar2 = Am_Object::Set(pAVar2,0x65,pAVar4,0);
  Am_From_Owner((Am_Slot_Key)&local_128,0x66,1.0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&local_128);
  pAVar2 = Am_Object::Set(pAVar2,0x66,pAVar4,0);
  Am_Rest_Of_Height_Above((Am_Slot_Key)&local_118,(uint)Am_UNDO_OPTIONS);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&local_118);
  pAVar2 = Am_Object::Set(pAVar2,0x67,pAVar4,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar2 = Am_Object::Set(pAVar2,0x18a,true,0);
  Am_Object::Create(&local_b0,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_2c,"left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value(&local_2c);
  pAVar5 = Am_Object::Set(&local_b0,0xb9,&local_100,0);
  pAVar5 = Am_Object::Set(pAVar5,0xcd,10.0,0);
  pAVar5 = Am_Object::Set(pAVar5,0xba,am_on_selectable_match_line_part.from_wrapper,0);
  Am_Object::Get_Object(&local_a8,(Am_Slot_Key)pAVar5,0xc5);
  pAVar5 = Am_Object::Set(&local_a8,0xca,am_select_line_part.from_wrapper,0);
  pAVar5 = Am_Object::Set(pAVar5,0x154,-1,0);
  Am_Object::Get_Owner(&local_a0,(Am_Slot_Flags)pAVar5);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x1ac,&local_a0,0);
  Am_Object::Create(&local_c8,(char *)&Am_One_Shot_Interactor);
  Am_Input_Char::Am_Input_Char(&local_30,"double_left_down",true);
  Am_Input_Char::operator_cast_to_Am_Value(&local_30);
  pAVar5 = Am_Object::Set(&local_c8,0xb9,&local_e8,0);
  pAVar5 = Am_Object::Set(pAVar5,0xcd,10.0,0);
  pAVar5 = Am_Object::Set(pAVar5,0xba,am_on_selectable_match_line_part.from_wrapper,0);
  Am_Object::Get_Object(&local_c0,(Am_Slot_Key)pAVar5,0xc5);
  pAVar5 = Am_Object::Set(&local_c0,0xca,am_generalize_match_double_click.from_wrapper,0);
  pAVar5 = Am_Object::Set(pAVar5,0x154,-1,0);
  Am_Object::Get_Owner(&local_b8,(Am_Slot_Flags)pAVar5);
  pAVar2 = Am_Object::Add_Part(pAVar2,0x1b8,&local_b8,0);
  pAVar2 = Am_Object::operator=(&sg,pAVar2);
  Am_Object::Am_Object(&local_98,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_98,0);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_c0);
  Am_Value::~Am_Value(&local_e8);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_a8);
  Am_Value::~Am_Value(&local_100);
  Am_Object::~Am_Object(&local_b0);
  Am_Formula::~Am_Formula(&local_118);
  Am_Formula::~Am_Formula(&local_128);
  Am_Formula::~Am_Formula((Am_Formula *)&accel_input_widget);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::Get_Object((Am_Object *)&local_128,(Am_Slot_Key)&sg,0x1d2);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,0x96,-4,0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&menu_vis_if_before_after);
  pAVar2 = Am_Object::Set(pAVar2,0x69,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x17d,false,0);
  Am_Object::Get_Object(&accel_input_widget,(Am_Slot_Key)pAVar2,0xa5);
  Am_Object::Set(&accel_input_widget,0x84,false,0);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  Am_Object::Get_Object(&accel_input_widget,(Am_Slot_Key)&sg,0xc5);
  Am_Object::Set(&accel_input_widget,0xca,am_clear_select_line_part.from_wrapper,0);
  Am_Object::~Am_Object(&accel_input_widget);
  AVar1 = Am_UNDO_OPTIONS;
  Am_Object::Create((Am_Object *)&local_128,(char *)&Am_Button_Panel);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Center_X_Is_Center_Of_Owner);
  pAVar2 = Am_Object::Set((Am_Object *)&local_128,100,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0xa1,10,0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Bottom_Is_Bottom_Of_Owner);
  pAVar2 = Am_Object::Set(pAVar2,0x65,pAVar4,0);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Motif_Light_Green);
  pAVar2 = Am_Object::Set(pAVar2,0x6a,pAVar3,0);
  pAVar4 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Horizontal_Layout);
  pAVar2 = Am_Object::Set(pAVar2,0x94,pAVar4,0);
  pAVar2 = Am_Object::Set(pAVar2,0x95,0x14,0);
  pAVar2 = Am_Object::Set(pAVar2,0x96,0,0);
  pAVar2 = Am_Object::Set(pAVar2,0x9c,0,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&accel_input_widget);
  Am_Object::Create((Am_Object *)&local_118,(char *)&Am_Standard_OK_Command);
  pAVar5 = Am_Object::Set((Am_Object *)&local_118,0xca,am_invoke_ok.from_wrapper,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add((Am_Value_List *)&accel_input_widget,pAVar3,Am_TAIL,true);
  Am_Object::Create((Am_Object *)&local_100,(char *)&Am_Standard_Cancel_Command);
  pAVar5 = Am_Object::Set((Am_Object *)&local_100,0xca,am_invoke_cancel.from_wrapper,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
  pAVar6 = Am_Value_List::Add(pAVar6,pAVar3,Am_TAIL,true);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar6);
  pAVar2 = Am_Object::Set(pAVar2,0xa2,pAVar3,0);
  Am_Object::Am_Object(&local_d0,pAVar2);
  Am_Object::Add_Part(&am_invoke_window,AVar1,&local_d0,0);
  Am_Object::~Am_Object(&local_d0);
  Am_Object::~Am_Object((Am_Object *)&local_100);
  Am_Object::~Am_Object((Am_Object *)&local_118);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&accel_input_widget);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  Am_Object::Create(&local_d8,(char *)&Am_Tab_To_Next_Widget_Interactor);
  Am_Object::Add_Part(&am_invoke_window,&local_d8,true,0);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::Get_Object(&accel_input_widget,0x9b60,0x152);
  Am_Object::Get_Object((Am_Object *)&local_128,sibling,0x1ac);
  pAVar2 = Am_Object::Set_Name((Am_Object *)&local_128,(char *)0x0);
  pAVar2 = Am_Object::Set(pAVar2,0xbd,0,0);
  Am_Object::Set(pAVar2,0xe3,single_char_method.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_128);
  Am_Object::Am_Object((Am_Object *)in_RDI,&am_invoke_window);
  Am_Object::~Am_Object(&accel_input_widget);
  Am_Object::~Am_Object(&sg);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object
am_invoke_window_Initialize()
{

  Am_Before_After_Match_Command =
      Am_Command.Create(DSTR("Am_Before_After_Match_Command"))
          .Set(Am_LABEL, "Before_After_Match")
          .Add(Am_SHOW_SCRIPT_COMMAND, (0L))
          .Add(Am_COMMANDS_IN_SCRIPT, (0L))
          .Add(Am_COMMANDS_PROTOTYPES, (0L))
          .Add(Am_COMMAND, (0L))
          .Add(Am_ORIGINAL_COMMAND_LIST, (0L))
          .Add(Am_PLACEHOLDER_LIST, (0L))
          .Add(Am_PLACEHOLDER_COUNT, (0L))

          .Add(Am_BEFORE_OR_AFTER, (0L))
          .Add(Am_BEFORE_OR_AFTER_COMMAND, (0L))
          .Add(Am_ORIG_COMMAND, (0L))
          .Add(Am_INSTALLED_ON_COMMAND, (0L))
          .Add(Am_WIDGET_FOR_COMMAND, (0L))
          .Add(Am_SCRIPT_EXECUTE_COMMAND, (0L))
          .Add(Am_SLOTS_TO_SAVE, (0L));
  am_invoke_window = Am_Window.Create(DSTR("script_invoke"))
                         .Set(Am_DESTROY_WINDOW_METHOD,
                              Am_Default_Pop_Up_Window_Destroy_Method)
                         .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                         .Set(Am_TITLE, "How To Invoke Script")
                         .Set(Am_WIDTH, 470)
                         .Set(Am_HEIGHT, 350)

                         .Add(Am_INVOKE_MATCH_COMMAND, (0L))
                         .Add(Am_SCRIPT_WINDOW, (0L));
  am_invoke_window.Add_Part(
      Am_Text.Create(DSTR("main_title"))
          .Set(Am_LEFT, 6)
          .Set(Am_TOP, 11)
          .Set(Am_TEXT, "Specify how to invoke the script:")
          .Set(Am_FONT,
               Am_Font(Am_FONT_FIXED, true, false, false, Am_FONT_LARGE))
          .Set(Am_LINE_STYLE, Am_Black)
          .Set(Am_FILL_STYLE, Am_No_Style));
  am_invoke_window
      .Add_Part(Am_DO_ACCELERATOR,
                Am_Checkbox.Create(DSTR("Am_DO_ACCEL"))
                    .Set(Am_LEFT, 15)
                    .Set(Am_TOP, 42)
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                    .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "Accelerator Key:")
                    .Set(Am_ID, true)
                    .Get_Owner())
      .Add_Part(Am_ACCELERATOR,
                Am_Text_Input_Widget.Create(DSTR("accel_string"))
                    .Set(Am_LEFT, Am_Right_Of_Sibling(Am_DO_ACCELERATOR, 5))
                    .Set(Am_TOP, 40)
                    .Set(Am_WIDTH, 100)
                    .Set(Am_HEIGHT, 25)
                    .Get_Object(Am_COMMAND)
                    .Set(Am_LABEL, "")
                    .Get_Owner()
                    .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(
      Am_Button.Create(DSTR("no_accel"))
          .Set(Am_LEFT, Am_Right_Of_Sibling(Am_ACCELERATOR, 5))
          .Set(Am_TOP, 40)
          .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "None")
          .Set(Am_DO_METHOD, clear_accel)
          .Get_Owner()
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(Am_DO_MENU,
                            Am_Checkbox.Create(DSTR("Am_DO_MENU"))
                                .Set(Am_LEFT, 15)
                                .Set(Am_TOP, 80)
                                .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                                .Set(Am_ACTIVE_2, false) //NIY ***
                                .Get_Object(Am_COMMAND)
                                .Set(Am_LABEL, "In Application Menu:")
                                .Set(Am_ID, true)
                                .Get_Owner());
  am_invoke_window.Add_Part(Am_WHICH_APPL_MENU,
                            Am_Option_Button.Create(DSTR("which_menu"))
                                .Set(Am_LEFT, 180)
                                .Set(Am_TOP, 75)
                                .Set(Am_ACTIVE_2, false) //NIY ***
                                .Set(Am_ITEMS,           //**** TEMP
                                     Am_Value_List().Add("File").Add("Edit")

                                         )
                                .Get_Object(Am_COMMAND)
                                .Set(Am_DO_METHOD, do_top_menu_selected)
                                .Get_Owner()
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(Am_Text.Create(DSTR("before_item_text"))
                                .Set(Am_LEFT, 45)
                                .Set(Am_TOP, 115)
                                .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                                .Set(Am_TEXT, "Before Sub-Menu Item:"));
  am_invoke_window.Add_Part(Am_WHICH_APPL_SUB_MENU,
                            Am_Option_Button.Create(DSTR("which_sub_menu"))
                                .Set(Am_LEFT, 195)
                                .Set(Am_TOP, 110)
                                .Set(Am_ACTIVE_2, false) //NIY ***
                                .Set(Am_ITEMS,           //**** TEMP
                                     Am_Value_List()
                                         .Add("<At end>")
                                         .Add("<At top>")
                                         .Add("Open")
                                         .Add("Close"))
                                .Get_Object(Am_COMMAND)
                                .Get_Owner()
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green));
  am_invoke_window.Add_Part(Am_Checkbox.Create(DSTR("time"))
                                .Set(Am_LEFT, 15)
                                .Set(Am_TOP, 140)
                                .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
                                .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
                                .Set(Am_ACTIVE, false) //NIY ***
                                .Get_Object(Am_COMMAND)
                                .Set(Am_LABEL, "At time...")
                                .Set(Am_ID, true)
                                .Get_Owner());
  am_invoke_window.Add_Part(
      Am_BEFORE_OR_AFTER,
      Am_Checkbox_Panel.Create(DSTR("BEFORE_OR_AFTER"))
          .Set(Am_LEFT, 15)
          .Set(Am_TOP, 170)
          .Set(Am_FONT, Am_Font(Am_FONT_FIXED, true))
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "After Command")
                                      .Set(Am_ID, am_after_command))
                             .Add(Am_Command.Create()
                                      .Set(Am_LABEL, "Before Command")
                                      .Set(Am_ID, am_before_command)))
          .Set(Am_LAYOUT, Am_Vertical_Layout)
          .Set(Am_HOW_SET, Am_CHOICE_TOGGLE)
          .Set(Am_H_SPACING, 0)
          .Set(Am_V_SPACING, 0)
          .Set(Am_MAX_RANK, 0));
  am_invoke_window.Add_Part(
      Am_COMMAND_LOAD_BUTTON,
      Am_Button.Create(DSTR("Am_LOAD_BUTTON"))
          .Set(Am_LEFT, 145)
          .Set(Am_TOP, 185)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
          .Set(Am_ACTIVE, am_before_or_after_picked)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "Load")
          .Set(Am_DO_METHOD, am_load_current_command_from_main)
          .Get_Owner());
  am_invoke_window.Add_Part(
      Am_COMMAND_GENERALIZE_BUTTON,
      Am_Button.Create(DSTR("Am_COMMAND_GENERALIZE_BUTTON"))
          .Set(Am_LEFT, 290)
          .Set(Am_TOP, 190)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
          .Get_Object(Am_COMMAND)
          .Set(Am_LABEL, "Generalize")
          .Set(Am_DO_METHOD, am_pop_up_generalize_from_button)
          .Set(Am_ACTIVE, am_generalize_script_active)
          .Get_Owner());
  Am_Object sg;
  am_invoke_window.Add_Part(
      Am_UNDO_SCROLL_GROUP,
      sg = Am_Scrolling_Menu.Create(DSTR("cmds_in_script"))
               .Set(Am_LEFT, 15)
               .Set(Am_TOP, Am_Bottom_Of_Sibling(Am_BEFORE_OR_AFTER, 5))
               .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH, -34))
               .Set(Am_HEIGHT, Am_Rest_Of_Height_Above(Am_UNDO_OPTIONS, 15))
               .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
               .Set(Am_H_SCROLL_BAR, true)
               .Add_Part(
                   Am_INTERACTOR,
                   Am_One_Shot_Interactor.Create(DSTR("select_line_part"))
                       .Set(Am_START_WHEN, Am_Input_Char("left_down"))
                       .Set(Am_PRIORITY, 10.0)
                       .Set(Am_START_WHERE_TEST,
                            am_on_selectable_match_line_part)
                       .Get_Object(Am_COMMAND)
                       .Set(Am_DO_METHOD, am_select_line_part)
                       .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                       .Get_Owner())
               .Add_Part(
                   Am_ARROW_INTERACTOR,
                   Am_One_Shot_Interactor.Create(DSTR("double_clk"))
                       .Set(Am_START_WHEN, Am_Input_Char("double_left_down"))
                       .Set(Am_PRIORITY, 10.0)
                       .Set(Am_START_WHERE_TEST,
                            am_on_selectable_match_line_part)
                       .Get_Object(Am_COMMAND)
                       .Set(Am_DO_METHOD, am_generalize_match_double_click)
                       .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                       .Get_Owner()));
  sg.Get_Object(Am_SUB_MENU)
      .Set(Am_V_SPACING, -4)
      .Set(Am_VISIBLE, menu_vis_if_before_after)
      .Set(Am_ACTIVE_2, false) //don't need to select the item in the menu
      .Get_Object(Am_ITEM_PROTOTYPE)
      .Set(Am_PRETEND_TO_BE_LEAF, false);
  sg.Get_Object(Am_COMMAND).Set(Am_DO_METHOD, am_clear_select_line_part);

  am_invoke_window.Add_Part(
      Am_UNDO_OPTIONS,
      Am_Button_Panel.Create(DSTR("OK-cancel"))
          .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
          .Set(Am_BOTTOM_OFFSET, 10)
          .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
          .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
          .Set(Am_LAYOUT, Am_Horizontal_Layout)
          .Set(Am_H_SPACING, 20)
          .Set(Am_V_SPACING, 0)
          .Set(Am_MAX_RANK, 0)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add(Am_Standard_OK_Command.Create().Set(
                                 Am_DO_METHOD, am_invoke_ok))
                             .Add(Am_Standard_Cancel_Command.Create().Set(
                                 Am_DO_METHOD, am_invoke_cancel))));

  am_invoke_window.Add_Part(Am_Tab_To_Next_Widget_Interactor.Create());

  Am_Object accel_input_widget = am_invoke_window.Get_Object(Am_ACCELERATOR);
  accel_input_widget.Get_Object(Am_INTERACTOR)
      .Set_Name(DSTR("Get_Accel_Key_Inter"))
      .Set(Am_STOP_WHEN, (0L)) //stopped by single_char_method
      .Set(Am_TEXT_EDIT_METHOD, single_char_method);

  return am_invoke_window;
}